

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O3

SUNErrCode SUNProfiler_Create(SUNComm comm,char *title,SUNProfiler *p)

{
  uint uVar1;
  SUNErrCode SVar2;
  SUNProfiler __ptr;
  sunTimerStruct *psVar3;
  char *pcVar4;
  size_t sVar5;
  ulong capacity;
  
  __ptr = (SUNProfiler)malloc(0x28);
  *p = __ptr;
  SVar2 = 0;
  if (__ptr != (SUNProfiler)0x0) {
    psVar3 = sunTimerStructNew();
    __ptr->overhead = psVar3;
    if (psVar3 != (sunTimerStruct *)0x0) {
      clock_gettime(1,(timespec *)psVar3->tic);
      pcVar4 = getenv("SUNPROFILER_MAX_ENTRIES");
      if (pcVar4 == (char *)0x0) {
        capacity = 0xa00;
      }
      else {
        uVar1 = atoi(pcVar4);
        capacity = 0xa00;
        if (0 < (int)uVar1) {
          capacity = (ulong)uVar1;
        }
      }
      SVar2 = SUNHashMap_New(capacity,sunProfilerDestroyKeyValue,&__ptr->map);
      if (SVar2 == 0) {
        if (comm != 0) {
          free(__ptr);
          return -1;
        }
        __ptr->comm = 0;
        sVar5 = strlen(title);
        pcVar4 = (char *)malloc(sVar5 + 1);
        __ptr->title = pcVar4;
        strcpy(pcVar4,title);
        __ptr->sundials_time = 0.0;
        sunStopTiming(__ptr->overhead);
        return 0;
      }
      sunTimerStructFree(__ptr->overhead);
    }
    free(__ptr);
    *p = (SUNProfiler)0x0;
    SVar2 = -0x2704;
  }
  return SVar2;
}

Assistant:

SUNErrCode SUNProfiler_Create(SUNComm comm, const char* title, SUNProfiler* p)
{
  SUNProfiler profiler;
  int max_entries;
  char* max_entries_env;

  *p = profiler = (SUNProfiler)malloc(sizeof(struct SUNProfiler_));

  if (profiler == NULL) { return SUN_SUCCESS; }

  profiler->overhead = sunTimerStructNew();
  if (!profiler->overhead)
  {
    free(profiler);
    *p = profiler = NULL;
    return SUN_ERR_MALLOC_FAIL;
  }

  sunStartTiming(profiler->overhead);

  /* Check to see if max entries env variable was set, and use if it was. */
  max_entries     = 2560;
  max_entries_env = getenv("SUNPROFILER_MAX_ENTRIES");
  if (max_entries_env) { max_entries = atoi(max_entries_env); }
  if (max_entries <= 0) { max_entries = 2560; }

  /* Create the hashmap used to store the timers */
  if (SUNHashMap_New(max_entries, sunProfilerDestroyKeyValue, &profiler->map))
  {
    sunTimerStructFree((void*)profiler->overhead);
    free(profiler);
    *p = profiler = NULL;
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Attach the comm, duplicating it if MPI is used. */
#if SUNDIALS_MPI_ENABLED
  profiler->comm = SUN_COMM_NULL;
  if (comm != SUN_COMM_NULL) { MPI_Comm_dup(comm, &profiler->comm); }
#else
  if (comm != SUN_COMM_NULL)
  {
    free(profiler);
    return -1;
  }
  profiler->comm = SUN_COMM_NULL;
#endif

  /* Copy the title of the profiler (note strlen does not include terminating
     null character hence the +1) */
  profiler->title = malloc((strlen(title) + 1) * sizeof(char));
  strcpy(profiler->title, title);

  /* Initialize the overall timer to 0. */
  profiler->sundials_time = 0.0;

  SUNDIALS_MARK_BEGIN(profiler, SUNDIALS_ROOT_TIMER);
  sunStopTiming(profiler->overhead);

  return SUN_SUCCESS;
}